

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.h
# Opt level: O2

int decoder_get_uint_value(ndn_decoder_t *decoder,uint32_t length,uint64_t *value)

{
  uint uVar1;
  uint8_t *puVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  uint64_t uVar7;
  uint32_t local_20;
  byte local_19;
  uint32_t temp_value_1;
  uint8_t temp_value;
  
  iVar3 = -0xd;
  switch(length) {
  case 1:
    local_19 = 0;
    decoder_get_byte_value(decoder,&local_19);
    uVar4 = (ulong)local_19;
    break;
  case 2:
    uVar1 = decoder->offset;
    if (decoder->input_size < uVar1 + 2) {
      uVar7 = 0;
    }
    else {
      uVar7 = (uint64_t)CONCAT11(decoder->input_value[uVar1],decoder->input_value[uVar1 + 1]);
      decoder->offset = uVar1 + 2;
    }
    *value = uVar7;
    return 0;
  default:
    goto switchD_0010c743_caseD_3;
  case 4:
    local_20 = 0;
    decoder_get_uint32_value(decoder,&local_20);
    uVar4 = (ulong)local_20;
    break;
  case 8:
    uVar6 = decoder->offset;
    uVar1 = uVar6 + 8;
    if (decoder->input_size < uVar1) {
      return 0;
    }
    *value = 0;
    puVar2 = decoder->input_value;
    uVar7 = 0;
    for (lVar5 = 0x38; lVar5 != -8; lVar5 = lVar5 + -8) {
      uVar7 = uVar7 + ((ulong)puVar2[uVar6] << ((byte)lVar5 & 0x3f));
      *value = uVar7;
      uVar6 = uVar6 + 1;
    }
    decoder->offset = uVar1;
    goto LAB_0010c771;
  }
  *value = uVar4;
LAB_0010c771:
  iVar3 = 0;
switchD_0010c743_caseD_3:
  return iVar3;
}

Assistant:

static inline int
decoder_get_uint_value(ndn_decoder_t* decoder, uint32_t length, uint64_t* value)
{
  if (length == 1) {
    uint8_t temp_value = 0;
    decoder_get_byte_value(decoder, &temp_value);
    *value = (uint64_t)temp_value;
  }
  else if (length == 2) {
    uint16_t temp_value = 0;
    decoder_get_uint16_value(decoder, &temp_value);
    *value = (uint64_t)temp_value;
  }
  else if (length == 4) {
    uint32_t temp_value = 0;
    decoder_get_uint32_value(decoder, &temp_value);
    *value = (uint64_t)temp_value;
  }
  else if (length == 8) {
    decoder_get_uint64_value(decoder, value);
  }
  else {
    return NDN_WRONG_TLV_LENGTH;
  }
  return 0;
}